

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O0

void __thiscall ReconnectingHub::connectionCreated(ReconnectingHub *this,Stream *stream)

{
  ostream *poVar1;
  string local_38;
  Stream *local_18;
  Stream *stream_local;
  ReconnectingHub *this_local;
  
  this->connected = true;
  local_18 = stream;
  stream_local = (Stream *)this;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Connected to ");
  Dashel::Stream::getTargetName_abi_cxx11_(&local_38,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void connectionCreated(Stream* stream)
	{
		connected = true;
		cout << endl
			 << "Connected to " << stream->getTargetName() << endl;
	}